

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O2

void __thiscall TTD::EventLog::UpdateComputedMode(EventLog *this)

{
  TTModeStack *this_00;
  uint32 uVar1;
  uint32 uVar2;
  TTDMode TVar3;
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  ScriptContext **ppSVar4;
  TTDMode TVar5;
  int32 i;
  int index;
  
  this_00 = &this->m_modeStack;
  uVar1 = TTModeStack::Count(this_00);
  if (uVar1 == 0) {
    TTDAbort_unrecoverable_error("Should never be empty!!!");
  }
  uVar1 = 0;
  TVar5 = Invalid;
  do {
    uVar2 = TTModeStack::Count(this_00);
    if (uVar2 <= uVar1) {
      this->m_currentMode = TVar5;
      this_01 = ThreadContextTTD::GetTTDContexts(this->m_threadContext->TTDContext);
      for (index = 0;
          index < (this_01->
                  super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>).
                  count; index = index + 1) {
        ppSVar4 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                  ::Item(&this_01->
                          super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                         ,index);
        SetModeFlagsOnContext(this,*ppSVar4);
      }
      return;
    }
    TVar3 = TTModeStack::GetAt(this_00,uVar1);
    switch(TVar3) {
    case RecordMode:
    case ReplayMode:
      if (uVar1 != 0) {
        TTDAbort_unrecoverable_error("One of these should always be first on the stack.");
      }
      break;
    case RecordMode|CurrentlyEnabled:
    case ReplayMode|CurrentlyEnabled:
    case ReplayMode|RecordMode:
    case ReplayMode|RecordMode|CurrentlyEnabled:
switchD_00805460_caseD_3:
      TTDAbort_unrecoverable_error("This mode is unknown or should never appear.");
    default:
      if ((((TVar3 != ExcludedExecutionTTAction) && (TVar3 != ExcludedExecutionDebuggerAction)) &&
          (TVar3 != DebuggerSuppressGetter)) &&
         ((TVar3 != DebuggerSuppressBreakpoints && (TVar3 != DebuggerLogBreakpoints))))
      goto switchD_00805460_caseD_3;
    case CurrentlyEnabled:
    case DebuggerAttachedMode:
      if (uVar1 == 0) {
        TTDAbort_unrecoverable_error("A base mode should always be first on the stack.");
      }
      TVar3 = TVar3 | TVar5;
    }
    uVar1 = uVar1 + 1;
    TVar5 = TVar3;
  } while( true );
}

Assistant:

void EventLog::UpdateComputedMode()
    {
        TTDAssert(this->m_modeStack.Count() > 0, "Should never be empty!!!");

        TTDMode cm = TTDMode::Invalid;
        for(uint32 i = 0; i < this->m_modeStack.Count(); ++i)
        {
            TTDMode m = this->m_modeStack.GetAt(i);
            switch(m)
            {
            case TTDMode::RecordMode:
            case TTDMode::ReplayMode:
                TTDAssert(i == 0, "One of these should always be first on the stack.");
                cm = m;
                break;
            case TTDMode::DebuggerAttachedMode:
            case TTDMode::CurrentlyEnabled:
            case TTDMode::ExcludedExecutionTTAction:
            case TTDMode::ExcludedExecutionDebuggerAction:
            case TTDMode::DebuggerSuppressGetter:
            case TTDMode::DebuggerSuppressBreakpoints:
            case TTDMode::DebuggerLogBreakpoints:
                TTDAssert(i != 0, "A base mode should always be first on the stack.");
                cm |= m;
                break;
            default:
                TTDAssert(false, "This mode is unknown or should never appear.");
                break;
            }
        }

        this->m_currentMode = cm;

        //Set fast path values on ThreadContext
        const JsUtil::List<Js::ScriptContext*, HeapAllocator>& contexts = this->m_threadContext->TTDContext->GetTTDContexts();
        for(int32 i = 0; i < contexts.Count(); ++i)
        {
            this->SetModeFlagsOnContext(contexts.Item(i));
        }
    }